

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86_avx512::forward
          (Eltwise_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *m;
  Mat *this_00;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int q;
  ulong uVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [64];
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  float *pfVar14;
  uint *puVar15;
  float *pfVar16;
  pointer pMVar17;
  uint *puVar18;
  float *pfVar19;
  undefined1 (*pauVar20) [64];
  undefined4 *puVar21;
  int iVar22;
  ulong uVar23;
  size_t b_3;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float fVar29;
  undefined4 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->c;
  iVar11 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar22 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    iVar22 = (this->super_Eltwise).op_type;
    if (iVar22 == 0) {
      pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar23 = 0;
      uVar8 = 0;
      if (0 < (int)uVar1) {
        uVar8 = (ulong)uVar1;
      }
      for (; uVar23 != uVar8; uVar23 = uVar23 + 1) {
        pvVar2 = m->data;
        pvVar3 = pMVar17[1].data;
        pvVar4 = this_00->data;
        lVar10 = this_00->elemsize * this_00->cstep * uVar23;
        lVar24 = pMVar17[1].elemsize * pMVar17[1].cstep * uVar23;
        lVar13 = m->elemsize * m->cstep * uVar23;
        lVar25 = 0;
        for (iVar22 = 0; iVar22 + 0xf < iVar11; iVar22 = iVar22 + 0x10) {
          auVar26 = vmulps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar25 + lVar24),
                                   *(undefined1 (*) [64])((long)pvVar2 + lVar25 + lVar13));
          *(undefined1 (*) [64])((long)pvVar4 + lVar25 + lVar10) = auVar26;
          lVar25 = lVar25 + 0x40;
        }
        for (; iVar22 + 7 < iVar11; iVar22 = iVar22 + 8) {
          pfVar14 = (float *)((long)pvVar3 + lVar25 + lVar24);
          pfVar16 = (float *)((long)pvVar2 + lVar25 + lVar13);
          auVar5._4_4_ = pfVar14[1] * pfVar16[1];
          auVar5._0_4_ = *pfVar14 * *pfVar16;
          auVar5._8_4_ = pfVar14[2] * pfVar16[2];
          auVar5._12_4_ = pfVar14[3] * pfVar16[3];
          auVar5._16_4_ = pfVar14[4] * pfVar16[4];
          auVar5._20_4_ = pfVar14[5] * pfVar16[5];
          auVar5._24_4_ = pfVar14[6] * pfVar16[6];
          auVar5._28_4_ = pfVar14[7];
          *(undefined1 (*) [32])((long)pvVar4 + lVar25 + lVar10) = auVar5;
          lVar25 = lVar25 + 0x20;
        }
        for (; iVar22 + 3 < iVar11; iVar22 = iVar22 + 4) {
          pfVar14 = (float *)((long)pvVar3 + lVar25 + lVar24);
          pfVar16 = (float *)((long)pvVar2 + lVar25 + lVar13);
          auVar31._0_4_ = *pfVar14 * *pfVar16;
          auVar31._4_4_ = pfVar14[1] * pfVar16[1];
          auVar31._8_4_ = pfVar14[2] * pfVar16[2];
          auVar31._12_4_ = pfVar14[3] * pfVar16[3];
          *(undefined1 (*) [16])((long)pvVar4 + lVar25 + lVar10) = auVar31;
          lVar25 = lVar25 + 0x10;
        }
        pfVar19 = (float *)((long)pvVar4 + lVar10 + lVar25);
        pfVar16 = (float *)((long)pvVar3 + lVar24 + lVar25);
        pfVar14 = (float *)((long)pvVar2 + lVar13 + lVar25);
        for (; iVar22 < iVar11; iVar22 = iVar22 + 1) {
          *pfVar19 = *pfVar16 * *pfVar14;
          pfVar14 = pfVar14 + 1;
          pfVar16 = pfVar16 + 1;
          pfVar19 = pfVar19 + 1;
        }
      }
      for (uVar23 = 2;
          pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar23 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar17) / 0x48);
          uVar23 = uVar23 + 1) {
        pMVar17 = pMVar17 + uVar23;
        for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
          pauVar9 = (undefined1 (*) [64])
                    (pMVar17->cstep * uVar7 * pMVar17->elemsize + (long)pMVar17->data);
          pauVar20 = (undefined1 (*) [64])
                     (this_00->cstep * uVar7 * this_00->elemsize + (long)this_00->data);
          for (iVar22 = 0; iVar22 + 0xf < iVar11; iVar22 = iVar22 + 0x10) {
            auVar26 = vmulps_avx512f(*pauVar9,*pauVar20);
            *pauVar20 = auVar26;
            pauVar9 = pauVar9 + 1;
            pauVar20 = pauVar20 + 1;
          }
          for (; iVar22 + 7 < iVar11; iVar22 = iVar22 + 8) {
            auVar6._4_4_ = *(float *)(*pauVar9 + 4) * *(float *)(*pauVar20 + 4);
            auVar6._0_4_ = *(float *)*pauVar9 * *(float *)*pauVar20;
            auVar6._8_4_ = *(float *)(*pauVar9 + 8) * *(float *)(*pauVar20 + 8);
            auVar6._12_4_ = *(float *)(*pauVar9 + 0xc) * *(float *)(*pauVar20 + 0xc);
            auVar6._16_4_ = *(float *)(*pauVar9 + 0x10) * *(float *)(*pauVar20 + 0x10);
            auVar6._20_4_ = *(float *)(*pauVar9 + 0x14) * *(float *)(*pauVar20 + 0x14);
            auVar6._24_4_ = *(float *)(*pauVar9 + 0x18) * *(float *)(*pauVar20 + 0x18);
            auVar6._28_4_ = *(undefined4 *)(*pauVar9 + 0x1c);
            *(undefined1 (*) [32])*pauVar20 = auVar6;
            pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
            pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x20);
          }
          for (; iVar22 + 3 < iVar11; iVar22 = iVar22 + 4) {
            auVar32._0_4_ = *(float *)*pauVar9 * *(float *)*pauVar20;
            auVar32._4_4_ = *(float *)(*pauVar9 + 4) * *(float *)(*pauVar20 + 4);
            auVar32._8_4_ = *(float *)(*pauVar9 + 8) * *(float *)(*pauVar20 + 8);
            auVar32._12_4_ = *(float *)(*pauVar9 + 0xc) * *(float *)(*pauVar20 + 0xc);
            *(undefined1 (*) [16])*pauVar20 = auVar32;
            pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
            pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
          }
          lVar10 = 0;
          for (; iVar22 < iVar11; iVar22 = iVar22 + 1) {
            *(float *)(*pauVar20 + lVar10) =
                 *(float *)(*pauVar20 + lVar10) * *(float *)(*pauVar9 + lVar10);
            lVar10 = lVar10 + 4;
          }
        }
      }
      iVar22 = (this->super_Eltwise).op_type;
    }
    if (iVar22 == 1) {
      uVar8 = 0;
      if (0 < (int)uVar1) {
        uVar8 = (ulong)uVar1;
      }
      pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->super_Eltwise).coeffs.w == 0) {
        for (uVar23 = 0; uVar23 != uVar8; uVar23 = uVar23 + 1) {
          pvVar2 = m->data;
          pvVar3 = pMVar17[1].data;
          pvVar4 = this_00->data;
          lVar10 = this_00->elemsize * this_00->cstep * uVar23;
          lVar24 = pMVar17[1].elemsize * pMVar17[1].cstep * uVar23;
          lVar13 = m->elemsize * m->cstep * uVar23;
          lVar25 = 0;
          for (iVar22 = 0; iVar22 + 0xf < iVar11; iVar22 = iVar22 + 0x10) {
            auVar26 = vaddps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar25 + lVar24),
                                     *(undefined1 (*) [64])((long)pvVar2 + lVar25 + lVar13));
            *(undefined1 (*) [64])((long)pvVar4 + lVar25 + lVar10) = auVar26;
            lVar25 = lVar25 + 0x40;
          }
          for (; iVar22 + 7 < iVar11; iVar22 = iVar22 + 8) {
            pfVar14 = (float *)((long)pvVar3 + lVar25 + lVar24);
            pfVar16 = (float *)((long)pvVar2 + lVar25 + lVar13);
            auVar36._0_4_ = *pfVar14 + *pfVar16;
            auVar36._4_4_ = pfVar14[1] + pfVar16[1];
            auVar36._8_4_ = pfVar14[2] + pfVar16[2];
            auVar36._12_4_ = pfVar14[3] + pfVar16[3];
            auVar36._16_4_ = pfVar14[4] + pfVar16[4];
            auVar36._20_4_ = pfVar14[5] + pfVar16[5];
            auVar36._24_4_ = pfVar14[6] + pfVar16[6];
            auVar36._28_4_ = pfVar14[7] + pfVar16[7];
            *(undefined1 (*) [32])((long)pvVar4 + lVar25 + lVar10) = auVar36;
            lVar25 = lVar25 + 0x20;
          }
          for (; iVar22 + 3 < iVar11; iVar22 = iVar22 + 4) {
            pfVar14 = (float *)((long)pvVar3 + lVar25 + lVar24);
            pfVar16 = (float *)((long)pvVar2 + lVar25 + lVar13);
            auVar34._0_4_ = *pfVar14 + *pfVar16;
            auVar34._4_4_ = pfVar14[1] + pfVar16[1];
            auVar34._8_4_ = pfVar14[2] + pfVar16[2];
            auVar34._12_4_ = pfVar14[3] + pfVar16[3];
            *(undefined1 (*) [16])((long)pvVar4 + lVar25 + lVar10) = auVar34;
            lVar25 = lVar25 + 0x10;
          }
          pfVar19 = (float *)((long)pvVar4 + lVar10 + lVar25);
          pfVar16 = (float *)((long)pvVar3 + lVar24 + lVar25);
          pfVar14 = (float *)((long)pvVar2 + lVar13 + lVar25);
          for (; iVar22 < iVar11; iVar22 = iVar22 + 1) {
            *pfVar19 = *pfVar16 + *pfVar14;
            pfVar14 = pfVar14 + 1;
            pfVar16 = pfVar16 + 1;
            pfVar19 = pfVar19 + 1;
          }
        }
        for (uVar23 = 2;
            pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar23 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar17) /
                            0x48); uVar23 = uVar23 + 1) {
          pMVar17 = pMVar17 + uVar23;
          for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
            pauVar9 = (undefined1 (*) [64])
                      (pMVar17->cstep * uVar7 * pMVar17->elemsize + (long)pMVar17->data);
            pauVar20 = (undefined1 (*) [64])
                       (this_00->cstep * uVar7 * this_00->elemsize + (long)this_00->data);
            for (iVar22 = 0; iVar22 + 0xf < iVar11; iVar22 = iVar22 + 0x10) {
              auVar26 = vaddps_avx512f(*pauVar9,*pauVar20);
              *pauVar20 = auVar26;
              pauVar9 = pauVar9 + 1;
              pauVar20 = pauVar20 + 1;
            }
            for (; iVar22 + 7 < iVar11; iVar22 = iVar22 + 8) {
              auVar37._0_4_ = *(float *)*pauVar9 + *(float *)*pauVar20;
              auVar37._4_4_ = *(float *)(*pauVar9 + 4) + *(float *)(*pauVar20 + 4);
              auVar37._8_4_ = *(float *)(*pauVar9 + 8) + *(float *)(*pauVar20 + 8);
              auVar37._12_4_ = *(float *)(*pauVar9 + 0xc) + *(float *)(*pauVar20 + 0xc);
              auVar37._16_4_ = *(float *)(*pauVar9 + 0x10) + *(float *)(*pauVar20 + 0x10);
              auVar37._20_4_ = *(float *)(*pauVar9 + 0x14) + *(float *)(*pauVar20 + 0x14);
              auVar37._24_4_ = *(float *)(*pauVar9 + 0x18) + *(float *)(*pauVar20 + 0x18);
              auVar37._28_4_ = *(float *)(*pauVar9 + 0x1c) + *(float *)(*pauVar20 + 0x1c);
              *(undefined1 (*) [32])*pauVar20 = auVar37;
              pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
              pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x20);
            }
            for (; iVar22 + 3 < iVar11; iVar22 = iVar22 + 4) {
              auVar35._0_4_ = *(float *)*pauVar9 + *(float *)*pauVar20;
              auVar35._4_4_ = *(float *)(*pauVar9 + 4) + *(float *)(*pauVar20 + 4);
              auVar35._8_4_ = *(float *)(*pauVar9 + 8) + *(float *)(*pauVar20 + 8);
              auVar35._12_4_ = *(float *)(*pauVar9 + 0xc) + *(float *)(*pauVar20 + 0xc);
              *(undefined1 (*) [16])*pauVar20 = auVar35;
              pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
              pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
            }
            lVar10 = 0;
            for (; iVar22 < iVar11; iVar22 = iVar22 + 1) {
              *(float *)(*pauVar20 + lVar10) =
                   *(float *)(*pauVar20 + lVar10) + *(float *)(*pauVar9 + lVar10);
              lVar10 = lVar10 + 4;
            }
          }
        }
      }
      else {
        for (uVar23 = 0; uVar23 != uVar8; uVar23 = uVar23 + 1) {
          pvVar2 = m->data;
          pvVar3 = pMVar17[1].data;
          pvVar4 = this_00->data;
          uVar7 = *(this->super_Eltwise).coeffs.data;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar7;
          auVar26 = vbroadcastss_avx512f(auVar33);
          auVar31 = vmovshdup_avx(auVar33);
          auVar27 = vbroadcastsd_avx512f(auVar31);
          lVar13 = this_00->elemsize * this_00->cstep * uVar23;
          lVar24 = pMVar17[1].elemsize * pMVar17[1].cstep * uVar23;
          lVar25 = m->elemsize * m->cstep * uVar23;
          lVar10 = 0;
          for (iVar22 = 0; iVar22 + 0xf < iVar11; iVar22 = iVar22 + 0x10) {
            auVar28 = vmulps_avx512f(auVar26,*(undefined1 (*) [64])((long)pvVar2 + lVar10 + lVar25))
            ;
            auVar28 = vfmadd231ps_avx512f(auVar28,auVar27,
                                          *(undefined1 (*) [64])((long)pvVar3 + lVar10 + lVar24));
            *(undefined1 (*) [64])((long)pvVar4 + lVar10 + lVar13) = auVar28;
            lVar10 = lVar10 + 0x40;
          }
          fVar29 = (float)uVar7;
          auVar40._0_8_ = auVar31._0_8_;
          auVar40._8_8_ = auVar40._0_8_;
          auVar40._16_8_ = auVar40._0_8_;
          auVar40._24_8_ = auVar40._0_8_;
          for (; iVar22 + 7 < iVar11; iVar22 = iVar22 + 8) {
            pfVar14 = (float *)((long)pvVar2 + lVar10 + lVar25);
            auVar26._0_4_ = fVar29 * *pfVar14;
            auVar26._4_4_ = fVar29 * pfVar14[1];
            auVar26._8_4_ = fVar29 * pfVar14[2];
            auVar26._12_4_ = fVar29 * pfVar14[3];
            auVar26._16_4_ = fVar29 * pfVar14[4];
            auVar26._20_4_ = fVar29 * pfVar14[5];
            auVar26._28_36_ = auVar27._28_36_;
            auVar26._24_4_ = fVar29 * pfVar14[6];
            auVar31 = vfmadd231ps_fma(auVar26._0_32_,auVar40,
                                      *(undefined1 (*) [32])((long)pvVar3 + lVar10 + lVar24));
            auVar27 = ZEXT1664(auVar31);
            *(undefined1 (*) [32])((long)pvVar4 + lVar10 + lVar13) = ZEXT1632(auVar31);
            lVar10 = lVar10 + 0x20;
          }
          auVar31 = vshufps_avx(auVar33,auVar33,0x55);
          for (; iVar22 + 3 < iVar11; iVar22 = iVar22 + 4) {
            pfVar14 = (float *)((long)pvVar2 + lVar10 + lVar25);
            auVar42._0_4_ = fVar29 * *pfVar14;
            auVar42._4_4_ = fVar29 * pfVar14[1];
            auVar42._8_4_ = fVar29 * pfVar14[2];
            auVar42._12_4_ = fVar29 * pfVar14[3];
            auVar32 = vfmadd231ps_fma(auVar42,auVar31,
                                      *(undefined1 (*) [16])((long)pvVar3 + lVar10 + lVar24));
            *(undefined1 (*) [16])((long)pvVar4 + lVar10 + lVar13) = auVar32;
            lVar10 = lVar10 + 0x10;
          }
          puVar21 = (undefined4 *)((long)pvVar4 + lVar13 + lVar10);
          puVar18 = (uint *)((long)pvVar3 + lVar24 + lVar10);
          puVar15 = (uint *)((long)pvVar2 + lVar25 + lVar10);
          for (; iVar22 < iVar11; iVar22 = iVar22 + 1) {
            auVar31 = vinsertps_avx(ZEXT416(*puVar15),ZEXT416(*puVar18),0x10);
            auVar38._0_4_ = auVar31._0_4_ * fVar29;
            auVar38._4_4_ = auVar31._4_4_ * (float)(uVar7 >> 0x20);
            auVar38._8_4_ = auVar31._8_4_ * 0.0;
            auVar38._12_4_ = auVar31._12_4_ * 0.0;
            auVar31 = vhaddps_avx(auVar38,auVar38);
            *puVar21 = auVar31._0_4_;
            puVar15 = puVar15 + 1;
            puVar18 = puVar18 + 1;
            puVar21 = puVar21 + 1;
          }
        }
        for (uVar23 = 2;
            pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar23 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar17) /
                            0x48); uVar23 = uVar23 + 1) {
          pMVar17 = pMVar17 + uVar23;
          for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
            pauVar9 = (undefined1 (*) [64])
                      (pMVar17->cstep * uVar7 * pMVar17->elemsize + (long)pMVar17->data);
            pauVar20 = (undefined1 (*) [64])
                       (this_00->cstep * uVar7 * this_00->elemsize + (long)this_00->data);
            auVar26 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)((long)(this->super_Eltwise).coeffs.data +
                                                  uVar23 * 4)));
            for (iVar22 = 0; iVar22 + 0xf < iVar11; iVar22 = iVar22 + 0x10) {
              auVar27 = vfmadd213ps_avx512f(*pauVar9,auVar26,*pauVar20);
              *pauVar20 = auVar27;
              pauVar9 = pauVar9 + 1;
              pauVar20 = pauVar20 + 1;
            }
            uVar30 = auVar26._0_4_;
            auVar41._4_4_ = uVar30;
            auVar41._0_4_ = uVar30;
            auVar41._8_4_ = uVar30;
            auVar41._12_4_ = uVar30;
            auVar41._16_4_ = uVar30;
            auVar41._20_4_ = uVar30;
            auVar41._24_4_ = uVar30;
            auVar41._28_4_ = uVar30;
            for (; iVar22 + 7 < iVar11; iVar22 = iVar22 + 8) {
              auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])*pauVar9,auVar41,
                                        *(undefined1 (*) [32])*pauVar20);
              *(undefined1 (*) [32])*pauVar20 = ZEXT1632(auVar31);
              pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
              pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x20);
            }
            auVar39._4_4_ = uVar30;
            auVar39._0_4_ = uVar30;
            auVar39._8_4_ = uVar30;
            auVar39._12_4_ = uVar30;
            for (; iVar22 + 3 < iVar11; iVar22 = iVar22 + 4) {
              auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar9,auVar39,
                                        *(undefined1 (*) [16])*pauVar20);
              *(undefined1 (*) [16])*pauVar20 = auVar31;
              pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
              pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
            }
            lVar10 = 0;
            for (; iVar22 < iVar11; iVar22 = iVar22 + 1) {
              auVar31 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar9 + lVar10)),auVar26._0_16_,
                                        ZEXT416(*(uint *)(*pauVar20 + lVar10)));
              *(int *)(*pauVar20 + lVar10) = auVar31._0_4_;
              lVar10 = lVar10 + 4;
            }
          }
        }
      }
    }
    iVar22 = 0;
    if ((this->super_Eltwise).op_type == 2) {
      pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar23 = 0;
      uVar8 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar8 = uVar23;
      }
      for (; uVar7 = 2, uVar23 != uVar8; uVar23 = uVar23 + 1) {
        pvVar2 = m->data;
        pvVar3 = pMVar17[1].data;
        pvVar4 = this_00->data;
        lVar10 = m->elemsize * m->cstep * uVar23;
        lVar24 = pMVar17[1].elemsize * pMVar17[1].cstep * uVar23;
        lVar13 = this_00->elemsize * this_00->cstep * uVar23;
        lVar25 = 0;
        for (iVar22 = 0; iVar22 + 0xf < iVar11; iVar22 = iVar22 + 0x10) {
          auVar26 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar2 + lVar25 + lVar10),
                                   *(undefined1 (*) [64])((long)pvVar3 + lVar25 + lVar24));
          *(undefined1 (*) [64])((long)pvVar4 + lVar25 + lVar13) = auVar26;
          lVar25 = lVar25 + 0x40;
        }
        for (; iVar22 + 7 < iVar11; iVar22 = iVar22 + 8) {
          auVar5 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar2 + lVar25 + lVar10),
                              *(undefined1 (*) [32])((long)pvVar3 + lVar25 + lVar24));
          *(undefined1 (*) [32])((long)pvVar4 + lVar25 + lVar13) = auVar5;
          lVar25 = lVar25 + 0x20;
        }
        for (; iVar22 + 3 < iVar11; iVar22 = iVar22 + 4) {
          auVar31 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar2 + lVar25 + lVar10),
                               *(undefined1 (*) [16])((long)pvVar3 + lVar25 + lVar24));
          *(undefined1 (*) [16])((long)pvVar4 + lVar25 + lVar13) = auVar31;
          lVar25 = lVar25 + 0x10;
        }
        puVar15 = (uint *)((long)pvVar2 + lVar10 + lVar25);
        puVar18 = (uint *)((long)pvVar3 + lVar24 + lVar25);
        puVar21 = (undefined4 *)((long)pvVar4 + lVar13 + lVar25);
        for (; iVar22 < iVar11; iVar22 = iVar22 + 1) {
          auVar31 = vmaxss_avx(ZEXT416(*puVar18),ZEXT416(*puVar15));
          *puVar21 = auVar31._0_4_;
          puVar15 = puVar15 + 1;
          puVar18 = puVar18 + 1;
          puVar21 = puVar21 + 1;
        }
      }
      iVar22 = 0;
      for (; pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar17) / 0x48);
          uVar7 = uVar7 + 1) {
        pMVar17 = pMVar17 + uVar7;
        for (uVar23 = 0; uVar23 != uVar8; uVar23 = uVar23 + 1) {
          pauVar9 = (undefined1 (*) [64])
                    (pMVar17->cstep * uVar23 * pMVar17->elemsize + (long)pMVar17->data);
          pauVar20 = (undefined1 (*) [64])
                     (this_00->cstep * uVar23 * this_00->elemsize + (long)this_00->data);
          for (iVar12 = 0; iVar12 + 0xf < iVar11; iVar12 = iVar12 + 0x10) {
            auVar26 = vmaxps_avx512f(*pauVar20,*pauVar9);
            *pauVar20 = auVar26;
            pauVar9 = pauVar9 + 1;
            pauVar20 = pauVar20 + 1;
          }
          for (; iVar12 + 7 < iVar11; iVar12 = iVar12 + 8) {
            auVar5 = vmaxps_avx(*(undefined1 (*) [32])*pauVar20,*(undefined1 (*) [32])*pauVar9);
            *(undefined1 (*) [32])*pauVar20 = auVar5;
            pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
            pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x20);
          }
          for (; iVar12 + 3 < iVar11; iVar12 = iVar12 + 4) {
            auVar31 = vmaxps_avx(*(undefined1 (*) [16])*pauVar20,*(undefined1 (*) [16])*pauVar9);
            *(undefined1 (*) [16])*pauVar20 = auVar31;
            pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
            pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
          }
          lVar10 = 0;
          for (; iVar12 < iVar11; iVar12 = iVar12 + 1) {
            auVar31 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar20 + lVar10)),
                                 ZEXT416(*(uint *)(*pauVar9 + lVar10)));
            *(int *)(*pauVar20 + lVar10) = auVar31._0_4_;
            lVar10 = lVar10 + 4;
          }
        }
      }
    }
  }
  return iVar22;
}

Assistant:

int Eltwise_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}